

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<kj::Maybe<int>_> __thiscall capnp::Capability::Client::getFd(Client *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  void *pvVar3;
  long in_RSI;
  TransformPromiseNodeBase *this_00;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise75;
  OwnPromiseNode intermediate;
  Maybe<int> fd;
  OwnPromiseNode local_90;
  undefined1 local_88 [16];
  undefined *local_78;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aStack_70;
  undefined8 local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  char local_58 [4];
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 local_54;
  Own<capnp::ClientHook,_std::nullptr_t> local_50;
  OwnPromiseNode local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  FixVoid<kj::Maybe<int>_> local_30;
  FixVoid<kj::Maybe<int>_> local_28;
  
  (**(code **)(**(long **)(in_RSI + 8) + 0x28))(local_58);
  if (local_58[0] == '\x01') {
    local_28.ptr.isSet = (bool)local_58[0];
    local_28.ptr.field_1 = local_54;
    local_58[0] = '\0';
    kj::Promise<kj::Maybe<int>_>::Promise((Promise<kj::Maybe<int>_> *)this,&local_28);
  }
  else {
    (**(code **)(**(long **)(in_RSI + 8) + 0x18))(&local_78);
    local_88[0] = local_78._0_1_;
    if (local_78._0_1_ == true) {
      local_88._8_8_ = aStack_70;
      aStack_70 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
                   )0x0;
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&local_78
              );
    if (local_88[0] == true) {
      (**(code **)(**(long **)(in_RSI + 8) + 0x20))(&local_50);
      kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
      attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_90,
                 (Own<capnp::ClientHook,_std::nullptr_t> *)(local_88 + 8));
      pPVar1 = ((local_90.ptr)->super_PromiseArenaMember).arena;
      if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_90.ptr - (long)pPVar1) < 0x28) {
        pvVar3 = operator_new(0x400);
        this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_90,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:76:48)>
                   ::anon_class_1_0_00000001_for_func::operator());
        *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00369310;
        *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
      }
      else {
        ((local_90.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
        this_00 = (TransformPromiseNodeBase *)&local_90.ptr[-3].super_PromiseArenaMember.arena;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_90,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:76:48)>
                   ::anon_class_1_0_00000001_for_func::operator());
        local_90.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00369310;
        local_90.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
      }
      local_78 = &DAT_0028d57f;
      aStack_70 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
                   )&DAT_0028d5de;
      local_68 = 0x4c0000058b;
      location.function = &DAT_0028d5de;
      location.fileName = &DAT_0028d57f;
      location.lineNumber = 0x58b;
      location.columnNumber = 0x4c;
      local_60.ptr = &this_00->super_PromiseNode;
      kj::_::maybeChain<kj::Maybe<int>>(&local_40,(Promise<kj::Maybe<int>_> *)&local_60,location);
      OVar2.ptr = local_40.ptr;
      local_40.ptr = (PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
      (this->hook).disposer = (Disposer *)OVar2.ptr;
      local_38.ptr = (PromiseNode *)0x0;
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_50);
    }
    else {
      local_30.ptr.isSet = false;
      kj::Promise<kj::Maybe<int>_>::Promise((Promise<kj::Maybe<int>_> *)this,&local_30);
    }
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)local_88)
    ;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<int>> Capability::Client::getFd() {
  auto fd = hook->getFd();
  if (fd != kj::none) {
    return fd;
  } else KJ_IF_SOME(promise, hook->whenMoreResolved()) {
    return promise.attach(hook->addRef()).then([](kj::Own<ClientHook> newHook) {
      return Client(kj::mv(newHook)).getFd();
    });
  } else {
    return kj::Maybe<int>(kj::none);
  }